

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setSettings(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,Settings *newSettings,bool init)

{
  Settings *pSVar1;
  bool bVar2;
  int i;
  long lVar3;
  bool bVar4;
  int i_3;
  
  pSVar1 = this->_currentSettings;
  lVar3 = 0;
  do {
    pSVar1->_boolParamValues[lVar3] = newSettings->_boolParamValues[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1a);
  lVar3 = 0;
  do {
    pSVar1->_intParamValues[lVar3] = newSettings->_intParamValues[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1c);
  lVar3 = 0;
  do {
    pSVar1->_realParamValues[lVar3] = newSettings->_realParamValues[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1b);
  bVar4 = true;
  lVar3 = 0;
  do {
    bVar2 = setBoolParam(this,(BoolParam)lVar3,this->_currentSettings->_boolParamValues[lVar3],init)
    ;
    bVar4 = (bool)(bVar4 & bVar2);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1a);
  lVar3 = 0;
  do {
    bVar2 = setIntParam(this,(IntParam)lVar3,this->_currentSettings->_intParamValues[lVar3],init);
    bVar4 = (bool)(bVar4 & bVar2);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1c);
  lVar3 = 0;
  do {
    bVar2 = setRealParam(this,(RealParam)lVar3,this->_currentSettings->_realParamValues[lVar3],init)
    ;
    bVar4 = (bool)(bVar4 & bVar2);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1b);
  return bVar4;
}

Assistant:

bool SoPlexBase<R>::setSettings(const Settings& newSettings, const bool init)
{
   assert(init || _isConsistent());

   bool success = true;

   *_currentSettings = newSettings;

   for(int i = 0; i < SoPlexBase<R>::BOOLPARAM_COUNT; i++)
      success &= setBoolParam((BoolParam)i, _currentSettings->_boolParamValues[i], init);

   for(int i = 0; i < SoPlexBase<R>::INTPARAM_COUNT; i++)
      success &= setIntParam((IntParam)i, _currentSettings->_intParamValues[i], init);

   for(int i = 0; i < SoPlexBase<R>::REALPARAM_COUNT; i++)
      success &= setRealParam((RealParam)i, _currentSettings->_realParamValues[i], init);

#ifdef SOPLEX_WITH_RATIONALPARAM

   for(int i = 0; i < SoPlexBase<R>::RATIONALPARAM_COUNT; i++)
      success &= setRationalParam((RationalParam)i, _currentSettings->_rationalParamValues[i], init);

#endif

   assert(_isConsistent());

   return success;
}